

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerResults.cpp
# Opt level: O1

void __thiscall
MDIOAnalyzerResults::GenerateExportFile
          (MDIOAnalyzerResults *this,char *file,DisplayBase display_base,U32 param_3)

{
  bool bVar1;
  ulonglong uVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  ostream *poVar6;
  long lVar7;
  ulonglong *puVar8;
  char *pcVar9;
  ulonglong *puVar10;
  U64 last_frame_id;
  Frame frame;
  U64 first_frame_id;
  char number_str2 [128];
  char number_str [128];
  char number_str_1 [128];
  ofstream file_stream;
  char time_str [128];
  ulong local_490;
  ulonglong local_488;
  undefined8 uStack_480;
  ulonglong local_478;
  undefined8 uStack_470;
  undefined2 local_468;
  ulonglong *local_458;
  uint local_44c;
  ulonglong local_448;
  ulonglong local_440;
  ulonglong local_438;
  undefined8 uStack_430;
  ulonglong local_428;
  undefined8 uStack_420;
  undefined2 local_418;
  ulonglong local_3b8;
  undefined8 uStack_3b0;
  ulonglong local_3a8;
  undefined8 uStack_3a0;
  undefined2 local_398;
  ulonglong local_338;
  undefined8 uStack_330;
  ulonglong local_328;
  undefined8 uStack_320;
  undefined2 local_318;
  long local_2b8;
  filebuf local_2b0 [240];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  std::ofstream::ofstream(&local_2b8,file,_S_out);
  local_448 = Analyzer::GetTriggerSample();
  local_44c = Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,
             "Time [s],Packet ID,MDIOClause,OP,PHYADDR,REGADDR/DEVTYPE,ADDR/DATA",0x42);
  std::ios::widen((char)(ostream *)&local_2b8 + (char)*(undefined8 *)(local_2b8 + -0x18));
  std::ostream::put((char)&local_2b8);
  std::ostream::flush();
  local_458 = (ulonglong *)AnalyzerResults::GetNumPackets();
  if (local_458 != (ulonglong *)0x0) {
    puVar8 = (ulonglong *)0x0;
    puVar10 = (ulonglong *)0x1;
    do {
      AnalyzerResults::GetFramesContainedInPacket((ulonglong)this,puVar8,&local_440);
      uVar2 = local_440;
      AnalyzerResults::GetFrame((ulonglong)&local_488);
      AnalyzerHelpers::GetTimeString(local_488,local_448,local_44c,local_b8,0x80);
      sVar5 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,local_b8,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,",",1);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
      lVar7 = 3;
      if ((char)local_468 == '\x01') {
        pcVar9 = "45,";
      }
      else if ((char)local_468 == '\0') {
        pcVar9 = "22,";
      }
      else {
        lVar7 = 1;
        pcVar9 = ",";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,pcVar9,lVar7);
      bVar4 = 0;
      if (uVar2 + 1 <= local_490) {
        AnalyzerResults::GetFrame((ulonglong)&local_3b8);
        local_468 = local_398;
        local_478 = local_3a8;
        uStack_470 = uStack_3a0;
        local_488 = local_3b8;
        uStack_480 = uStack_3b0;
        Frame::~Frame((Frame *)&local_3b8);
        bVar3 = (char)local_468 - 2;
        lVar7 = 1;
        pcVar9 = ",";
        if (bVar3 < 4) {
          pcVar9 = &DAT_0010916c + *(int *)(&DAT_0010916c + (ulong)bVar3 * 4);
          lVar7 = *(long *)(&DAT_00109358 + (ulong)bVar3 * 8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,pcVar9,lVar7);
        if (uVar2 + 2 <= local_490) {
          AnalyzerResults::GetFrame((ulonglong)&local_3b8);
          local_468 = local_398;
          local_478 = local_3a8;
          uStack_470 = uStack_3a0;
          local_488 = local_3b8;
          uStack_480 = uStack_3b0;
          Frame::~Frame((Frame *)&local_3b8);
          if ((char)local_468 != '\x06') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,",",1);
          }
          AnalyzerHelpers::GetNumberString(local_478,display_base,5,(char *)&local_3b8,0x80);
          sVar5 = strlen((char *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b8,(char *)&local_3b8,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,",",1);
          bVar4 = 0;
          if (uVar2 + 3 <= local_490) {
            AnalyzerResults::GetFrame((ulonglong)&local_438);
            local_468 = local_418;
            local_478 = local_428;
            uStack_470 = uStack_420;
            local_488 = local_438;
            uStack_480 = uStack_430;
            Frame::~Frame((Frame *)&local_438);
            AnalyzerHelpers::GetNumberString(local_478,display_base,5,(char *)&local_438,0x80);
            lVar7 = 1;
            switch((char)local_468) {
            case '\a':
              sVar5 = strlen((char *)&local_438);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2b8,(char *)&local_438,sVar5);
              pcVar9 = ",";
              break;
            case '\b':
              sVar5 = strlen((char *)&local_438);
              lVar7 = 0xb;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2b8,(char *)&local_438,sVar5);
              pcVar9 = "(Reserved),";
              break;
            case '\t':
              sVar5 = strlen((char *)&local_438);
              lVar7 = 10;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2b8,(char *)&local_438,sVar5);
              pcVar9 = "(PMD/PMA),";
              break;
            case '\n':
              sVar5 = strlen((char *)&local_438);
              lVar7 = 6;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2b8,(char *)&local_438,sVar5);
              pcVar9 = "(WIS),";
              break;
            case '\v':
              sVar5 = strlen((char *)&local_438);
              lVar7 = 6;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2b8,(char *)&local_438,sVar5);
              pcVar9 = "(PCS),";
              break;
            case '\f':
              sVar5 = strlen((char *)&local_438);
              lVar7 = 9;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2b8,(char *)&local_438,sVar5);
              pcVar9 = "(PHY XS),";
              break;
            case '\r':
              sVar5 = strlen((char *)&local_438);
              lVar7 = 9;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2b8,(char *)&local_438,sVar5);
              pcVar9 = "(DTE XS),";
              break;
            case '\x0e':
              sVar5 = strlen((char *)&local_438);
              lVar7 = 8;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2b8,(char *)&local_438,sVar5);
              pcVar9 = "(Other),";
              break;
            default:
              pcVar9 = ",";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,pcVar9,lVar7);
            bVar4 = 0;
            if (uVar2 + 4 <= local_490) {
              AnalyzerResults::GetFrame((ulonglong)&local_338);
              local_468 = local_318;
              local_478 = local_328;
              uStack_470 = uStack_320;
              local_488 = local_338;
              uStack_480 = uStack_330;
              Frame::~Frame((Frame *)&local_338);
              if ((char)local_468 != '\x0f') {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,",",1);
              }
              if (uVar2 + 5 <= local_490) {
                AnalyzerResults::GetFrame((ulonglong)&local_338);
                local_468 = local_318;
                local_478 = local_328;
                uStack_470 = uStack_320;
                local_488 = local_338;
                uStack_480 = uStack_330;
                Frame::~Frame((Frame *)&local_338);
                if ((byte)((char)local_468 - 0x10U) < 3) {
                  AnalyzerHelpers::GetNumberString
                            (local_478,display_base,0x10,(char *)&local_338,0x80);
                  sVar5 = strlen((char *)&local_338);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_2b8,(char *)&local_338,sVar5);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,",",1);
                }
                std::ios::widen((char)*(undefined8 *)(local_2b8 + -0x18) + (char)&local_2b8);
                std::ostream::put((char)&local_2b8);
                std::ostream::flush();
                bVar4 = AnalyzerResults::UpdateExportProgressAndCheckForCancel
                                  ((ulonglong)this,(ulonglong)puVar8);
              }
            }
          }
        }
      }
      Frame::~Frame((Frame *)&local_488);
      if ((bVar4 & 3) != 0) goto LAB_001078b2;
      bVar1 = puVar10 < local_458;
      puVar8 = puVar10;
      puVar10 = (ulonglong *)(ulong)((int)puVar10 + 1);
    } while (bVar1);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulonglong)local_458);
LAB_001078b2:
  local_2b8 = _VTT;
  *(undefined8 *)(local_2b0 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_2b0);
  std::ios_base::~ios_base(local_1c0);
  return;
}

Assistant:

void MDIOAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 /*export_type_user_id*/ )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    file_stream << "Time [s],Packet ID,MDIOClause,OP,PHYADDR,REGADDR/DEVTYPE,ADDR/DATA" << std::endl;

    U64 num_packets = GetNumPackets();

    for( U32 packet_id = 0; packet_id < num_packets; ++packet_id )
    {
        // get the frames contained in packet with index packet_id
        U64 first_frame_id;
        U64 last_frame_id;
        GetFramesContainedInPacket( packet_id, &first_frame_id, &last_frame_id );

        U64 frame_id = first_frame_id;

        // get MDIO_START frame to get the MDIOClause column value
        Frame frame = GetFrame( frame_id );

        char time_str[ 128 ];
        AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

        // Time [s] and Packet ID column
        file_stream << time_str << "," << packet_id << ",";

        if( frame.mType == MDIO_C22_START )
        {
            file_stream << "22,";
        }
        else if( frame.mType == MDIO_C45_START )
        {
            file_stream << "45,";
        }
        else
        {
            file_stream << ",";
        }

        ++frame_id;

        if( frame_id > last_frame_id )
        {
            continue;
        }

        // OP frame
        frame = GetFrame( frame_id );

        switch( frame.mType )
        {
        case MDIO_OP_W:
            file_stream << "Write,";
            break;
        case MDIO_OP_R:
            file_stream << "Read,";
            break;
        case MDIO_C45_OP_ADDR:
            file_stream << "Address,";
            break;
        case MDIO_C45_OP_READ_INC_ADDR:
            file_stream << "Read +Addr,";
            break;
        default:
            file_stream << ",";
            break;
        }

        ++frame_id;

        if( frame_id > last_frame_id )
        {
            continue;
        }

        // PHYADDR frame
        frame = GetFrame( frame_id );

        if( frame.mType != MDIO_PHYADDR )
        {
            file_stream << ",";
        }

        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );

        file_stream << number_str << ",";

        ++frame_id;

        if( frame_id > last_frame_id )
        {
            continue;
        }

        // REGADR or DEVTYPE frame
        frame = GetFrame( frame_id );

        char number_str2[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str2, 128 );

        switch( frame.mType )
        {
        case MDIO_C22_REGADDR:
            file_stream << number_str2 << ",";
            break;
        case MDIO_C45_DEVTYPE_RESERVED:
            file_stream << number_str2 << "(Reserved),";
            break;
        case MDIO_C45_DEVTYPE_PMD_PMA:
            file_stream << number_str2 << "(PMD/PMA),";
            break;
        case MDIO_C45_DEVTYPE_WIS:
            file_stream << number_str2 << "(WIS),";
            break;
        case MDIO_C45_DEVTYPE_PCS:
            file_stream << number_str2 << "(PCS),";
            break;
        case MDIO_C45_DEVTYPE_PHY_XS:
            file_stream << number_str2 << "(PHY XS),";
            break;
        case MDIO_C45_DEVTYPE_DTE_XS:
            file_stream << number_str2 << "(DTE XS),";
            break;
        case MDIO_C45_DEVTYPE_OTHER:
            file_stream << number_str2 << "(Other),";
            break;
        default:
            file_stream << ",";
        }

        ++frame_id;
        if( frame_id > last_frame_id )
        {
            continue;
        }

        // TA frame
        frame = GetFrame( frame_id );

        if( frame.mType != MDIO_TA )
        {
            file_stream << ",";
        }

        ++frame_id;
        if( frame_id > last_frame_id )
        {
            continue;
        }

        // MDIO_C22_DATA or MDIO_C45_ADDRDATA frame
        frame = GetFrame( frame_id );

        if( frame.mType == MDIO_C22_DATA || frame.mType == MDIO_C45_ADDR || frame.mType == MDIO_C45_DATA )
        {
            char number_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );
            file_stream << number_str;
        }
        else
        {
            file_stream << ",";
        }

        file_stream << std::endl;

        // check for cancel and update progress
        if( UpdateExportProgressAndCheckForCancel( packet_id, num_packets ) )
        {
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( num_packets, num_packets );
}